

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O2

bool __thiscall
chrono::utils::ChValidation::Process(ChValidation *this,string *sim_filename,char delim)

{
  size_t sVar1;
  ChValidation *this_00;
  long lVar2;
  ulong uVar3;
  double dVar4;
  
  sVar1 = ReadDataFile(sim_filename,delim,&this->m_sim_headers,&this->m_sim_data);
  this->m_num_rows = sVar1;
  sVar1 = (long)(this->m_sim_headers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_sim_headers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  this->m_num_cols = sVar1;
  std::valarray<double>::resize(&this->m_L2_norms,sVar1 - 1,0.0);
  std::valarray<double>::resize(&this->m_RMS_norms,this->m_num_cols - 1,0.0);
  this_00 = (ChValidation *)&this->m_INF_norms;
  std::valarray<double>::resize((valarray<double> *)this_00,this->m_num_cols - 1,0.0);
  lVar2 = 0x10;
  for (uVar3 = 0; uVar3 < this->m_num_cols - 1; uVar3 = uVar3 + 1) {
    dVar4 = L2norm(this_00,(DataVector *)
                           ((long)&((this->m_sim_data).
                                    super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2));
    (this->m_L2_norms)._M_data[uVar3] = dVar4;
    dVar4 = RMSnorm(this_00,(DataVector *)
                            ((long)&((this->m_sim_data).
                                     super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2));
    (this->m_RMS_norms)._M_data[uVar3] = dVar4;
    dVar4 = INFnorm(this_00,(DataVector *)
                            ((long)&((this->m_sim_data).
                                     super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2));
    lVar2 = lVar2 + 0x10;
    (this->m_INF_norms)._M_data[uVar3] = dVar4;
  }
  return true;
}

Assistant:

bool ChValidation::Process(const std::string& sim_filename,
                           char               delim)
{
  // Read the simulation results file.
  m_num_rows = ReadDataFile(sim_filename, delim, m_sim_headers, m_sim_data);
  m_num_cols = m_sim_headers.size();

  // Resize arrays of norms.
  m_L2_norms.resize(m_num_cols - 1);
  m_RMS_norms.resize(m_num_cols - 1);
  m_INF_norms.resize(m_num_cols - 1);

  // Calculate norms of the column vectors.
  for (size_t col = 0; col < m_num_cols - 1; col++) {
    m_L2_norms[col] = L2norm(m_sim_data[col + 1]);
    m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1]);
    m_INF_norms[col] = INFnorm(m_sim_data[col + 1]);
  }

  return true;
}